

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O3

void tvm::contrib::argsort<int,int>(DLTensor *input,DLTensor *output,int32_t axis,bool is_ascend)

{
  iterator __last;
  uint uVar1;
  undefined7 in_register_00000009;
  __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
  _Var2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> sorter;
  uint local_b4;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>,_std::pair<long,_int>_>
  local_b0;
  __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
  local_98;
  iterator iStack_90;
  pair<long,_int> *local_88;
  long local_78;
  undefined4 local_6c;
  long local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  ulong local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,is_ascend);
  local_40 = input->data;
  local_48 = output->data;
  local_98._M_current = (pair<long,_int> *)0x0;
  iStack_90._M_current = (pair<long,_int> *)0x0;
  local_88 = (pair<long,_int> *)0x0;
  lVar5 = (long)axis;
  uVar1 = 1;
  if ((long)input->ndim < 1) {
    local_b4 = 1;
  }
  else {
    lVar3 = 0;
    local_b4 = 1;
    do {
      if (lVar3 < lVar5) {
        uVar1 = uVar1 * (int)input->shape[lVar3];
      }
      else if (lVar5 < lVar3) {
        local_b4 = local_b4 * (int)input->shape[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (input->ndim != lVar3);
    if ((int)uVar1 < 1) {
      return;
    }
  }
  lVar3 = (long)(int)local_b4;
  local_60 = (ulong)uVar1;
  local_38 = (ulong)local_b4;
  local_78 = 0;
  uVar7 = 0;
  local_58 = lVar3;
  do {
    local_50 = uVar7;
    if (0 < (int)local_b4) {
      uVar7 = 0;
      do {
        if (iStack_90._M_current != local_98._M_current) {
          iStack_90._M_current = local_98._M_current;
        }
        local_68 = input->shape[lVar5];
        if (0 < local_68) {
          puVar4 = (undefined4 *)((long)local_40 + (local_78 * local_68 + uVar7) * 4);
          lVar6 = 0;
          do {
            local_b0._M_len._0_4_ = *puVar4;
            local_b0._M_original_len = lVar6;
            if (iStack_90._M_current == local_88) {
              std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>::
              _M_realloc_insert<std::pair<long,int>>
                        ((vector<std::pair<long,int>,std::allocator<std::pair<long,int>>> *)
                         &local_98,iStack_90,(pair<long,_int> *)&local_b0);
            }
            else {
              (iStack_90._M_current)->first = lVar6;
              *(ulong *)&(iStack_90._M_current)->second =
                   CONCAT44(local_b0._M_len._4_4_,(undefined4)local_b0._M_len);
              iStack_90._M_current = iStack_90._M_current + 1;
            }
            lVar6 = lVar6 + 1;
            puVar4 = puVar4 + lVar3;
          } while (lVar6 < input->shape[lVar5]);
        }
        __last._M_current = iStack_90._M_current;
        _Var2._M_current = local_98._M_current;
        if ((char)local_6c == '\0') {
          if (local_98._M_current != iStack_90._M_current) {
            lVar6 = (long)iStack_90._M_current - (long)local_98._M_current >> 4;
            std::
            _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>,_std::pair<long,_int>_>
            ::_Temporary_buffer(&local_b0,local_98,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
            if (local_b0._M_buffer == (pair<long,_int> *)0x0) {
              std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,int>const&,std::pair<long,int>const&)>>
                        (_Var2,(__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                                )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_int>_&,_const_std::pair<long,_int>_&)>
                          )0x12eb03);
            }
            else {
              std::
              __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,std::pair<long,int>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,int>const&,std::pair<long,int>const&)>>
                        (_Var2,(__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                                )__last._M_current,local_b0._M_buffer,
                         CONCAT44(local_b0._M_len._4_4_,(undefined4)local_b0._M_len),
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_int>_&,_const_std::pair<long,_int>_&)>
                          )0x12eb03);
            }
            goto LAB_0012aebf;
          }
        }
        else if (local_98._M_current != iStack_90._M_current) {
          lVar6 = (long)iStack_90._M_current - (long)local_98._M_current >> 4;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>,_std::pair<long,_int>_>
          ::_Temporary_buffer(&local_b0,local_98,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
          if (local_b0._M_buffer == (pair<long,_int> *)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,int>const&,std::pair<long,int>const&)>>
                      (_Var2,(__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                              )__last._M_current,
                       (_Iter_comp_iter<bool_(*)(const_std::pair<long,_int>_&,_const_std::pair<long,_int>_&)>
                        )0x12eaf9);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,std::pair<long,int>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,int>const&,std::pair<long,int>const&)>>
                      (_Var2,(__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                              )__last._M_current,local_b0._M_buffer,
                       CONCAT44(local_b0._M_len._4_4_,(undefined4)local_b0._M_len),
                       (_Iter_comp_iter<bool_(*)(const_std::pair<long,_int>_&,_const_std::pair<long,_int>_&)>
                        )0x12eaf9);
          }
LAB_0012aebf:
          operator_delete(local_b0._M_buffer,
                          CONCAT44(local_b0._M_len._4_4_,(undefined4)local_b0._M_len) << 4);
        }
        lVar6 = input->shape[lVar5];
        if (0 < lVar6) {
          puVar4 = (undefined4 *)((long)local_48 + (local_68 * local_78 + uVar7) * 4);
          _Var2._M_current = local_98._M_current;
          do {
            *puVar4 = (int)(_Var2._M_current)->first;
            puVar4 = puVar4 + lVar3;
            _Var2._M_current = _Var2._M_current + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_38);
    }
    uVar7 = local_50 + 1;
    local_78 = local_78 + local_58;
    if (uVar7 == local_60) {
      if (local_98._M_current != (pair<long,_int> *)0x0) {
        operator_delete(local_98._M_current,(long)local_88 - (long)local_98._M_current);
      }
      return;
    }
  } while( true );
}

Assistant:

void argsort(DLTensor *input, DLTensor *output, int32_t axis, bool is_ascend) {
  auto data_ptr = static_cast<DataType *>(input->data);
  auto out_ptr = static_cast<OutType *>(output->data);
  std::vector<std::pair<int64_t, DataType>> sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }

  for (int i = 0; i < axis_mul_before; ++i) {
    for (int j = 0; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t base_idx = i * input->shape[axis] * axis_mul_after + j;
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        int64_t full_idx = base_idx + k * axis_mul_after;
        sorter.emplace_back(std::make_pair(k, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        out_ptr[base_idx + k * axis_mul_after] = static_cast<OutType>(sorter[k].first);
      }
    }
  }
}